

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O3

void rf_draw_billboard_rec
               (rf_camera3d camera,rf_texture2d texture,rf_rec source_rec,rf_vec3 center,float size,
               rf_color tint)

{
  int iVar1;
  rf_render_batch *prVar2;
  long lVar3;
  rf_vertex_buffer *prVar4;
  rf_gfx_texcoord_data_type *prVar5;
  float fVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  float fVar10;
  float in_XMM1_Dc;
  float in_XMM1_Dd;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  rf_mat mat_view;
  undefined1 local_118 [8];
  rf_rec arStack_110 [2];
  float local_e8;
  float fStack_e4;
  float local_d8;
  float fStack_d4;
  rf_mat local_68;
  
  fVar12 = center.z;
  arStack_110[0]._0_8_ = source_rec._0_8_;
  local_118 = (undefined1  [8])source_rec._0_8_;
  rf_mat_look_at(&local_68,camera.position,camera.target,camera.up);
  prVar2 = (rf__ctx->field_0).current_batch;
  lVar3 = prVar2->current_buffer;
  prVar4 = prVar2->vertex_buffers;
  if (prVar4[lVar3].elements_count * 4 <= prVar4[lVar3].v_counter + 4) {
    rf_gfx_draw();
  }
  local_d8 = source_rec.width;
  fStack_d4 = source_rec.height;
  fVar15 = size * 0.5;
  fVar6 = ((fStack_d4 * size) / local_d8) * 0.5;
  fVar10 = fVar6 * 0.0;
  fVar11 = fVar10 + local_68.m8 * fVar15;
  local_e8 = center.x;
  fStack_e4 = center.y;
  fVar13 = fVar6 + local_68.m4 * fVar15;
  fVar14 = fVar10 + fVar15 * local_68.m0;
  fVar16 = local_68.m8 * fVar15 - fVar10;
  fVar6 = local_68.m4 * fVar15 - fVar6;
  fVar10 = fVar15 * local_68.m0 - fVar10;
  rf_gfx_enable_texture(texture.id);
  rf_gfx_begin(RF_QUADS);
  rf_gfx_color4ub(tint.r,tint.g,tint.b,tint.a);
  prVar2 = (rf__ctx->field_0).current_batch;
  lVar3 = prVar2->current_buffer;
  prVar4 = prVar2->vertex_buffers;
  iVar1 = prVar4[lVar3].tc_counter;
  auVar9._4_4_ = (float)texture.height;
  auVar9._0_4_ = (float)texture.width;
  auVar7._4_4_ = (float)texture.height;
  auVar7._0_4_ = (float)texture.width;
  auVar7._8_8_ = 0;
  auVar7 = divps(_local_118,auVar7);
  *(long *)(prVar4[lVar3].texcoords + (long)iVar1 * 2) = auVar7._0_8_;
  prVar4[lVar3].tc_counter = iVar1 + 1;
  rf_gfx_vertex3f(local_e8 - fVar10,fStack_e4 - fVar6,fVar12 - fVar16);
  prVar2 = (rf__ctx->field_0).current_batch;
  lVar3 = prVar2->current_buffer;
  prVar4 = prVar2->vertex_buffers;
  prVar5 = prVar4[lVar3].texcoords;
  iVar1 = prVar4[lVar3].tc_counter;
  arStack_110[0].width = auVar7._0_4_;
  prVar5[(long)iVar1 * 2] = arStack_110[0].width;
  prVar4[lVar3].tc_counter = iVar1 + 1;
  local_118._0_4_ = source_rec.x;
  local_118._4_4_ = source_rec.y;
  arStack_110[0].x = source_rec.x;
  arStack_110[0].y = source_rec.y;
  auVar8._0_4_ = (float)local_118._0_4_ + local_d8;
  auVar8._4_4_ = (float)local_118._4_4_ + fStack_d4;
  auVar8._8_4_ = arStack_110[0].x + in_XMM1_Dc;
  auVar8._12_4_ = arStack_110[0].y + in_XMM1_Dd;
  auVar9._8_8_ = 0;
  auVar9 = divps(auVar8,auVar9);
  prVar5[iVar1 * 2 + 1] = auVar9._4_4_;
  rf_gfx_vertex3f(local_e8 - fVar14,fStack_e4 - fVar13,fVar12 - fVar11);
  prVar2 = (rf__ctx->field_0).current_batch;
  lVar3 = prVar2->current_buffer;
  prVar4 = prVar2->vertex_buffers;
  iVar1 = prVar4[lVar3].tc_counter;
  local_118 = auVar9._0_8_;
  *(undefined1 (*) [8])(prVar4[lVar3].texcoords + (long)iVar1 * 2) = local_118;
  prVar4[lVar3].tc_counter = iVar1 + 1;
  rf_gfx_vertex3f(local_e8 + fVar10,fStack_e4 + fVar6,fVar16 + fVar12);
  prVar2 = (rf__ctx->field_0).current_batch;
  lVar3 = prVar2->current_buffer;
  prVar4 = prVar2->vertex_buffers;
  prVar5 = prVar4[lVar3].texcoords;
  iVar1 = prVar4[lVar3].tc_counter;
  local_118._0_4_ = auVar9._0_4_;
  prVar5[(long)iVar1 * 2] = (rf_gfx_texcoord_data_type)local_118._0_4_;
  arStack_110[0].height = auVar7._4_4_;
  prVar5[iVar1 * 2 + 1] = arStack_110[0].height;
  prVar4[lVar3].tc_counter = iVar1 + 1;
  rf_gfx_vertex3f(fVar14 + local_e8,fVar13 + fStack_e4,fVar11 + fVar12);
  rf_gfx_end();
  rf_gfx_disable_texture();
  return;
}

Assistant:

RF_API void rf_draw_billboard_rec(rf_camera3d camera, rf_texture2d texture, rf_rec source_rec, rf_vec3 center, float size, rf_color tint)
{
    // NOTE: Billboard size will maintain source_rec aspect ratio, size will represent billboard width
    rf_vec2 size_ratio = {size, size * (float)source_rec.height / source_rec.width };

    rf_mat mat_view = rf_mat_look_at(camera.position, camera.target, camera.up);

    rf_vec3 right = {mat_view.m0, mat_view.m4, mat_view.m8 };
    //rf_vec3 up = { mat_view.m1, mat_view.m5, mat_view.m9 };

    // NOTE: Billboard locked on axis-Y
    rf_vec3 up = {0.0f, 1.0f, 0.0f };
    /*
        a-------b
        |       |
        |   *   |
        |       |
        d-------c
    */
    right = rf_vec3_scale(right, size_ratio.x / 2);
    up = rf_vec3_scale(up, size_ratio.y / 2);

    rf_vec3 p1 = rf_vec3_add(right, up);
    rf_vec3 p2 = rf_vec3_sub(right, up);

    rf_vec3 a = rf_vec3_sub(center, p2);
    rf_vec3 b = rf_vec3_add(center, p1);
    rf_vec3 c = rf_vec3_add(center, p2);
    rf_vec3 d = rf_vec3_sub(center, p1);

    if (rf_gfx_check_buffer_limit(4)) rf_gfx_draw();

    rf_gfx_enable_texture(texture.id);

    rf_gfx_begin(RF_QUADS);
    rf_gfx_color4ub(tint.r, tint.g, tint.b, tint.a);

    // Bottom-left corner for texture and quad
    rf_gfx_tex_coord2f((float)source_rec.x/texture.width, (float)source_rec.y/texture.height);
    rf_gfx_vertex3f(a.x, a.y, a.z);

    // Top-left corner for texture and quad
    rf_gfx_tex_coord2f((float)source_rec.x/texture.width, (float)(source_rec.y + source_rec.height)/texture.height);
    rf_gfx_vertex3f(d.x, d.y, d.z);

    // Top-right corner for texture and quad
    rf_gfx_tex_coord2f((float)(source_rec.x + source_rec.width)/texture.width, (float)(source_rec.y + source_rec.height)/texture.height);
    rf_gfx_vertex3f(c.x, c.y, c.z);

    // Bottom-right corner for texture and quad
    rf_gfx_tex_coord2f((float)(source_rec.x + source_rec.width)/texture.width, (float)source_rec.y/texture.height);
    rf_gfx_vertex3f(b.x, b.y, b.z);
    rf_gfx_end();

    rf_gfx_disable_texture();
}